

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O1

Bool prvTidynodeHasText(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  Bool BVar2;
  ulong uVar3;
  bool bVar4;
  
  if (node != (Node *)0x0 && doc != (TidyDocImpl *)0x0) {
    uVar3 = (ulong)node->start;
    bVar4 = node->start < node->end;
    if (bVar4) {
      pLVar1 = doc->lexer;
      BVar2 = prvTidyIsWhite((int)pLVar1->lexbuf[uVar3]);
      while (BVar2 != no) {
        uVar3 = uVar3 + 1;
        bVar4 = uVar3 < node->end;
        if (!bVar4) {
          return no;
        }
        BVar2 = prvTidyIsWhite((int)pLVar1->lexbuf[uVar3]);
      }
      if (bVar4) {
        return yes;
      }
    }
  }
  return no;
}

Assistant:

Bool TY_(nodeHasText)( TidyDocImpl* doc, Node* node )
{
  if ( doc && node )
  {
    uint ix;
    Lexer* lexer = doc->lexer;
    for ( ix = node->start; ix < node->end; ++ix )
    {
        /* whitespace */
        if ( !TY_(IsWhite)( lexer->lexbuf[ix] ) )
            return yes;
    }
  }
  return no;
}